

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

vector<double> * __thiscall
mat_lib::vector<double>::operator+
          (vector<double> *__return_storage_ptr__,vector<double> *this,element_t rhs)

{
  size_t sVar1;
  pointer pdVar2;
  pointer pdVar3;
  size_t sVar4;
  
  vector(__return_storage_ptr__,this->max_size__);
  sVar1 = this->max_size__;
  if (sVar1 != 0) {
    pdVar2 = (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (__return_storage_ptr__->container__).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    sVar4 = 0;
    do {
      pdVar3[sVar4] = pdVar2[sVar4] + rhs;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

vector operator+(const element_t rhs){
          vector<element_t> res(this->size());

          for (int i = 0; i < this->size(); ++i) {
              res.set(i,container__[i] + rhs);
          }

          return res;
      }